

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist_test.cpp
# Opt level: O0

pint p_test_case_plist_invalid_test(void)

{
  pint pVar1;
  long lVar2;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  lVar2 = p_list_remove(0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x5f);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar2 = p_list_last(0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x60);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar2 = p_list_length(0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x61);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar2 = p_list_reverse(0);
  if (lVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plist_test.cpp"
           ,0x62);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_list_free(0);
  p_list_foreach(0,0);
  p_libsys_shutdown();
  pVar1 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

P_TEST_CASE_BEGIN (plist_invalid_test)
{
	p_libsys_init ();

	P_TEST_CHECK (p_list_remove (NULL, NULL) == NULL);
	P_TEST_CHECK (p_list_last (NULL) == NULL);
	P_TEST_CHECK (p_list_length (NULL) == 0);
	P_TEST_CHECK (p_list_reverse (NULL) == NULL);

	p_list_free (NULL);
	p_list_foreach (NULL, NULL, NULL);

	p_libsys_shutdown ();
}